

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          *samples,bool logBucketPerformance)

{
  pointer *ppUVar1;
  undefined8 *puVar2;
  uint uVar3;
  pointer pUVar4;
  pointer pUVar5;
  deUint64 dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  float fVar10;
  uint uVar11;
  SampleBuilder *pSVar12;
  ulong uVar13;
  pointer pUVar14;
  string *psVar15;
  LogNumber<float> *unit;
  ulong uVar16;
  ulong uVar17;
  int numBytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  long lVar18;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *__buf_20;
  void *__buf_21;
  void *__buf_22;
  void *__buf_23;
  void *__buf_24;
  void *__buf_25;
  void *__buf_26;
  void *__buf_27;
  long lVar19;
  undefined8 *puVar20;
  uint uVar21;
  int __fd;
  pointer __p;
  int in_R8D;
  int endNdx;
  undefined8 uVar22;
  offset_in_SingleOperationDuration_to_deUint64 in_R9;
  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  *this;
  _anonymous_namespace_ *p_Var23;
  long lVar24;
  size_t __n_00;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float xmax;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [12];
  UploadSampleAnalyzeResult UVar37;
  allocator<char> local_b42;
  allocator<char> local_b41;
  allocator<char> local_b40;
  allocator<char> local_b3f;
  allocator<char> local_b3e;
  allocator<char> local_b3d;
  allocator<char> local_b3c;
  allocator<char> local_b3b;
  allocator<char> local_b3a;
  allocator<char> local_b39;
  allocator<char> local_b38;
  allocator<char> local_b37;
  allocator<char> local_b36;
  allocator<char> local_b35;
  allocator<char> local_b34;
  allocator<char> local_b33;
  allocator<char> local_b32;
  allocator<char> local_b31;
  allocator<char> local_b30;
  allocator<char> local_b2f;
  allocator<char> local_b2e;
  allocator<char> local_b2d;
  allocator<char> local_b2c;
  allocator<char> local_b2b;
  allocator<char> local_b2a;
  allocator<char> local_b29;
  allocator<char> local_b28;
  allocator<char> local_b27;
  allocator<char> local_b26;
  allocator<char> local_b25;
  allocator<char> local_b24;
  allocator<char> local_b23;
  allocator<char> local_b22;
  allocator<char> local_b21;
  _anonymous_namespace_ *local_b20;
  allocator<char> local_b12;
  allocator<char> local_b11;
  long local_b10;
  undefined1 local_b08 [16];
  long local_af0;
  ScopedLogSection section_1;
  StatsType stats;
  LineParametersWithConfidence theilSenFitting;
  string local_a48;
  string local_a28;
  string local_a08;
  string local_9e8;
  string local_9c8;
  ScopedLogSection section;
  string local_988;
  string local_968;
  string local_948;
  string local_928;
  string local_908;
  string local_8e8;
  string local_8c8;
  string local_8a8;
  string local_888;
  string local_868;
  LineParametersWithConfidence endApproximation;
  LineParametersWithConfidence startApproximation;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  ScopedLogSection section_2;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
  buckets [4];
  LogNumber<float> local_4b8;
  LogNumber<float> local_450;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  string local_3c0;
  LogNumber<float> local_3a0;
  LogNumber<float> local_338;
  LogNumber<float> local_2d0;
  LogNumber<float> local_268;
  LogNumber<float> local_200;
  LogNumber<float> local_198;
  LogNumber<float> local_130;
  LogNumber<float> local_c8;
  StatsType resultStats;
  
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>>
            (&theilSenFitting,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              *)0x0,(int)((ulong)((long)(samples->
                                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(samples->
                                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 5),in_R8D,
             in_R9);
  calculateSampleStatistics(&resultStats,&theilSenFitting,samples);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&startApproximation,"Samples",(allocator<char> *)&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&endApproximation,"Samples",(allocator<char> *)&local_4b8);
  psVar15 = (string *)&endApproximation;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&startApproximation,psVar15);
  std::__cxx11::string::~string((string *)&endApproximation);
  std::__cxx11::string::~string((string *)&startApproximation);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"Samples",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_130,"Samples",(allocator<char> *)&local_888);
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_338,&local_3a0.m_name,&local_130.m_name)
  ;
  __fd = (int)log;
  tcu::LogSampleList::write((LogSampleList *)&local_338,__fd,__buf,(size_t)psVar15);
  tcu::TestLog::startSampleInfo(log);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"WrittenSize",(allocator<char> *)&local_5f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"Written size",(allocator<char> *)&local_8a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"bytes",(allocator<char> *)&local_8c8);
  unit = &local_268;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&startApproximation,&local_198.m_name,&local_200.m_name,&unit->m_name,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&startApproximation,__fd,__buf_00,(size_t)unit);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,"BufferSize",(allocator<char> *)&local_618);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"Buffer size",(allocator<char> *)&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buckets,"bytes",(allocator<char> *)&local_908);
  psVar15 = (string *)buckets;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&endApproximation,&local_2d0.m_name,&local_c8.m_name,psVar15,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::LogValueInfo::write((LogValueInfo *)&endApproximation,__fd,__buf_01,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stats,"UploadTime",(allocator<char> *)&local_638);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e8,"Upload time",(allocator<char> *)&local_928);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a08,"us",(allocator<char> *)&local_948);
  psVar15 = &local_a08;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_450,(string *)&stats,&local_9e8,psVar15,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::LogValueInfo::write((LogValueInfo *)&local_450,__fd,__buf_02,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"FitResidual",(allocator<char> *)&local_658);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a28,"Fit residual",(allocator<char> *)&local_968);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a48,"us",(allocator<char> *)&local_988);
  psVar15 = &local_a48;
  uVar22 = 1;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_4b8,&local_9c8,&local_a28,psVar15,QP_SAMPLE_VALUE_TAG_RESPONSE);
  local_b20 = (_anonymous_namespace_ *)samples;
  tcu::LogValueInfo::write((LogValueInfo *)&local_4b8,__fd,__buf_03,(size_t)psVar15);
  tcu::TestLog::endSampleInfo(log);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_a48);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_9c8);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&local_450);
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&stats);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&endApproximation);
  std::__cxx11::string::~string((string *)buckets);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_2d0);
  tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&startApproximation);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_198);
  tcu::LogSampleList::~LogSampleList((LogSampleList *)&local_338);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_3a0);
  lVar19 = 0;
  for (lVar24 = 0; lVar18 = *(long *)local_b20,
      lVar24 < (int)((ulong)((long)*(pointer *)(local_b20 + 8) - lVar18) >> 5); lVar24 = lVar24 + 1)
  {
    local_b08._0_4_ = (float)*(ulong *)(lVar18 + 0x18 + lVar19);
    local_b10 = CONCAT44(local_b10._4_4_,
                         (float)*(int *)(lVar18 + 8 + lVar19) * theilSenFitting.coefficient +
                         theilSenFitting.offset);
    startApproximation._8_16_ = ZEXT416(0);
    stack0xfffffffffffff838 = 0;
    startApproximation._0_8_ = log;
    pSVar12 = tcu::SampleBuilder::operator<<
                        ((SampleBuilder *)&startApproximation,*(int *)(lVar18 + 8 + lVar19));
    pSVar12 = tcu::SampleBuilder::operator<<(pSVar12,*(int *)(*(long *)local_b20 + lVar19));
    pSVar12 = tcu::SampleBuilder::operator<<(pSVar12,*(int *)(*(long *)local_b20 + 0x10 + lVar19));
    pSVar12 = tcu::SampleBuilder::operator<<(pSVar12,(float)local_b08._0_4_ - (float)local_b10);
    tcu::SampleBuilder::operator<<(pSVar12,(EndSampleToken *)&tcu::TestLog::EndSample);
    std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
    ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                   *)&startApproximation.offsetConfidenceLower);
    lVar19 = lVar19 + 0x20;
  }
  tcu::TestLog::endSampleList(log);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  endNdx = (int)uVar22;
  if (logBucketPerformance) {
    buckets[3].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    buckets[3].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buckets[2].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buckets[3].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    buckets[2].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    buckets[2].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    buckets[1].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    buckets[1].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buckets[0].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buckets[1].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    buckets[0].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    buckets[0].
    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar19 = *(long *)local_b20;
    pUVar14 = *(pointer *)(local_b20 + 8);
    lVar24 = (long)(int)((ulong)((long)pUVar14 - lVar19) >> 5);
    lVar18 = 0;
    if (lVar24 < 1) {
      lVar24 = lVar18;
    }
    uVar21 = 0;
    uVar25 = 0;
    uVar11 = 0;
    for (; lVar24 * 0x20 != lVar18; lVar18 = lVar18 + 0x20) {
      uVar3 = *(uint *)(lVar19 + 4 + lVar18);
      in_R9 = (offset_in_SingleOperationDuration_to_deUint64)uVar3;
      if ((int)uVar3 < (int)uVar21 || uVar21 == 0) {
        uVar11 = uVar25;
        uVar21 = uVar3;
      }
      uVar22 = CONCAT71((int7)((ulong)uVar22 >> 8),uVar11 == 0);
      if ((int)uVar11 < (int)uVar3 || uVar11 == 0) {
        uVar11 = uVar3;
        uVar25 = uVar3;
      }
    }
    __p = (pointer)(ulong)(uVar25 - uVar21);
    local_b08._0_4_ = (float)(int)(uVar25 - uVar21);
    lVar24 = 0;
    lVar18 = 0;
    p_Var23 = local_b20;
    while (lVar18 < (int)((ulong)((long)pUVar14 - lVar19) >> 5)) {
      puVar20 = (undefined8 *)(lVar19 + lVar24);
      local_b10 = lVar24;
      local_af0 = lVar18;
      fVar26 = floorf(((float)(int)(*(int *)(lVar19 + 4 + lVar24) - uVar21) / (float)local_b08._0_4_
                      ) * 4.0);
      uVar11 = (uint)fVar26;
      if (2 < (int)uVar11) {
        uVar11 = 3;
      }
      uVar17 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar17 = 0;
      }
      pUVar14 = buckets[uVar17].
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pUVar14 ==
          buckets[uVar17].
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pUVar4 = buckets[uVar17].
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __n_00 = (long)pUVar14 - (long)pUVar4;
        if (__n_00 == 0x7fffffffffffffe0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar16 = (long)__n_00 >> 5;
        uVar13 = uVar16;
        if (pUVar14 == pUVar4) {
          uVar13 = 1;
        }
        this = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                *)(uVar13 + uVar16);
        if ((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
             *)0x3fffffffffffffe < this) {
          this = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                  *)0x3ffffffffffffff;
        }
        if (CARRY8(uVar13,uVar16)) {
          this = (_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                  *)0x3ffffffffffffff;
        }
        pUVar14 = std::
                  _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                  ::_M_allocate(this,(size_t)__p);
        uVar7 = *puVar20;
        uVar8 = puVar20[1];
        uVar9 = puVar20[3];
        puVar2 = (undefined8 *)((long)pUVar14 + __n_00 + 0x10);
        *puVar2 = puVar20[2];
        puVar2[1] = uVar9;
        *(undefined8 *)((long)pUVar14 + __n_00) = uVar7;
        ((undefined8 *)((long)pUVar14 + __n_00))[1] = uVar8;
        __n = extraout_RDX;
        if (0 < (long)__n_00) {
          memmove(pUVar14,pUVar4,__n_00);
          __n = extraout_RDX_00;
        }
        __p = (pointer)((long)buckets[uVar17].
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pUVar4 >> 5
                       );
        std::
        _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
        ::_M_deallocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                         *)pUVar4,__p,__n);
        buckets[uVar17].
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pUVar14;
        buckets[uVar17].
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pUVar14 + __n_00 + 0x20);
        buckets[uVar17].
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar14 + (long)this;
        p_Var23 = local_b20;
      }
      else {
        pUVar4 = (pointer)*puVar20;
        pUVar5 = (pointer)puVar20[1];
        dVar6 = puVar20[3];
        (pUVar14->duration).totalDuration = (deUint64)puVar20[2];
        (pUVar14->duration).fitResponseDuration = dVar6;
        (((_Vector_impl *)&pUVar14->bufferSize)->super__Vector_impl_data)._M_start = pUVar4;
        *(pointer *)&pUVar14->writtenSize = pUVar5;
        ppUVar1 = &buckets[uVar17].
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppUVar1 = *ppUVar1 + 1;
      }
      lVar19 = *(long *)p_Var23;
      pUVar14 = *(pointer *)(p_Var23 + 8);
      lVar24 = local_b10 + 0x20;
      lVar18 = local_af0 + 1;
    }
    lVar19 = 0x48;
    lVar24 = 0;
    while (lVar24 != 4) {
      if (buckets[lVar24].
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          buckets[lVar24].
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar24 = lVar24 + 1;
      }
      else {
        calculateSampleStatistics(&stats,&theilSenFitting,buckets + lVar24);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&startApproximation,"BufferSizeRange",(allocator<char> *)&local_338);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&endApproximation,"Transfer performance with buffer size in range [",
                   (allocator<char> *)&local_3a0);
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_450.m_name,
                   (_anonymous_namespace_ *)
                   (ulong)((int)((float)(int)lVar24 * 0.25 * (float)local_b08._0_4_) + uVar21),
                   numBytes);
        auVar36 = std::__cxx11::string::append((char *)&local_450);
        lVar24 = lVar24 + 1;
        Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
                  (&local_4b8.m_name,
                   (_anonymous_namespace_ *)
                   (ulong)((int)((float)(int)lVar24 * 0.25 * (float)local_b08._0_4_) + uVar21),
                   auVar36._8_4_);
        std::__cxx11::string::append((char *)&local_4b8);
        std::__cxx11::string::append(auVar36._0_8_);
        psVar15 = (string *)std::__cxx11::string::append((string *)&endApproximation);
        tcu::ScopedLogSection::ScopedLogSection
                  (&section_1,log,(string *)&startApproximation,psVar15);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&endApproximation);
        std::__cxx11::string::~string((string *)&startApproximation);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"Min",&local_b21);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a08,"Total: Min time",&local_b22);
        psVar15 = &local_9c8;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"us",&local_b23);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&startApproximation,&local_9e8,&local_a08,psVar15,
                   QP_KEY_TAG_TIME,stats.result.minTime);
        tcu::LogNumber<float>::write
                  ((LogNumber<float> *)&startApproximation,__fd,__buf_04,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a28,"Max",&local_b24);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a48,"Total: Max time",&local_b25);
        psVar15 = (string *)&section;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"us",&local_b26);
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)&endApproximation,&local_a28,&local_a48,psVar15,
                   QP_KEY_TAG_TIME,stats.result.maxTime);
        tcu::LogNumber<float>::write
                  ((LogNumber<float> *)&endApproximation,__fd,__buf_05,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"Min90",&local_b27);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_888,"Total: 90%-Min time",&local_b28);
        psVar15 = &local_5f8;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"us",&local_b29);
        tcu::LogNumber<float>::LogNumber
                  (&local_450,&local_868,&local_888,psVar15,QP_KEY_TAG_TIME,
                   stats.result.min2DecileTime);
        tcu::LogNumber<float>::write(&local_450,__fd,__buf_06,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a8,"Max90",&local_b2a);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c8,"Total: 90%-Max time",&local_b2b);
        psVar15 = &local_618;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"us",&local_b2c);
        tcu::LogNumber<float>::LogNumber
                  (&local_4b8,&local_8a8,&local_8c8,psVar15,QP_KEY_TAG_TIME,
                   stats.result.max9DecileTime);
        tcu::LogNumber<float>::write(&local_4b8,__fd,__buf_07,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"Median",&local_b2d)
        ;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_908,"Total: Median time",&local_b2e);
        psVar15 = &local_638;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"us",&local_b2f);
        tcu::LogNumber<float>::LogNumber
                  (&local_338,&local_8e8,&local_908,psVar15,QP_KEY_TAG_TIME,stats.result.medianTime)
        ;
        tcu::LogNumber<float>::write(&local_338,__fd,__buf_08,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_928,"MedianTransfer",&local_b30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_948,"Median transfer rate",&local_b31);
        psVar15 = &local_658;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"MB / s",&local_b32);
        tcu::LogNumber<float>::LogNumber
                  (&local_3a0,&local_928,&local_948,psVar15,QP_KEY_TAG_PERFORMANCE,
                   stats.medianRate * 0.0009765625 * 0.0009765625);
        tcu::LogNumber<float>::write(&local_3a0,__fd,__buf_09,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_968,"MaxDiff",&local_b33);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_988,"Max difference to approximated",&local_b34);
        psVar15 = &local_538;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"us",&local_b35);
        tcu::LogNumber<float>::LogNumber
                  (&local_130,&local_968,&local_988,psVar15,QP_KEY_TAG_TIME,stats.maxDiffTime);
        tcu::LogNumber<float>::write(&local_130,__fd,__buf_10,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_678,"Max90Diff",&local_b36);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_698,"90%-Max difference to approximated",&local_b37);
        psVar15 = &local_558;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"us",&local_b38);
        tcu::LogNumber<float>::LogNumber
                  (&local_198,&local_678,&local_698,psVar15,QP_KEY_TAG_TIME,stats.maxDiff9DecileTime
                  );
        tcu::LogNumber<float>::write(&local_198,__fd,__buf_11,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b8,"MedianDiff",&local_b39);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6d8,"Median difference to approximated",&local_b3a);
        psVar15 = &local_578;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"us",&local_b3b);
        tcu::LogNumber<float>::LogNumber
                  (&local_200,&local_6b8,&local_6d8,psVar15,QP_KEY_TAG_TIME,stats.medianDiffTime);
        tcu::LogNumber<float>::write(&local_200,__fd,__buf_12,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6f8,"MaxRelDiff",&local_b3c);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_718,"Max relative difference to approximated",&local_b3d);
        psVar15 = &local_598;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"%",&local_b3e);
        tcu::LogNumber<float>::LogNumber
                  (&local_268,&local_6f8,&local_718,psVar15,QP_KEY_TAG_NONE,
                   stats.maxRelDiffTime * 100.0);
        tcu::LogNumber<float>::write(&local_268,__fd,__buf_13,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_738,"Max90RelDiff",&local_b3f);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_758,"90%-Max relative difference to approximated",&local_b40);
        psVar15 = &local_5b8;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"%",&local_b41);
        tcu::LogNumber<float>::LogNumber
                  (&local_2d0,&local_738,&local_758,psVar15,QP_KEY_TAG_NONE,
                   stats.max9DecileRelDiffTime * 100.0);
        tcu::LogNumber<float>::write(&local_2d0,__fd,__buf_14,(size_t)psVar15);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_778,"MedianRelDiff",&local_b42);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&section_2,"Median relative difference to approximated",&local_b11);
        psVar15 = &local_3c0;
        std::__cxx11::string::string<std::allocator<char>>((string *)psVar15,"%",&local_b12);
        uVar22 = 0;
        tcu::LogNumber<float>::LogNumber
                  (&local_c8,&local_778,(string *)&section_2,psVar15,QP_KEY_TAG_NONE,
                   stats.medianRelDiffTime * 100.0);
        tcu::LogNumber<float>::write(&local_c8,__fd,__buf_15,(size_t)psVar15);
        tcu::LogNumber<float>::~LogNumber(&local_c8);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::__cxx11::string::~string((string *)&section_2);
        std::__cxx11::string::~string((string *)&local_778);
        tcu::LogNumber<float>::~LogNumber(&local_2d0);
        std::__cxx11::string::~string((string *)&local_5b8);
        std::__cxx11::string::~string((string *)&local_758);
        std::__cxx11::string::~string((string *)&local_738);
        tcu::LogNumber<float>::~LogNumber(&local_268);
        std::__cxx11::string::~string((string *)&local_598);
        std::__cxx11::string::~string((string *)&local_718);
        std::__cxx11::string::~string((string *)&local_6f8);
        tcu::LogNumber<float>::~LogNumber(&local_200);
        std::__cxx11::string::~string((string *)&local_578);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::~string((string *)&local_6b8);
        tcu::LogNumber<float>::~LogNumber(&local_198);
        std::__cxx11::string::~string((string *)&local_558);
        std::__cxx11::string::~string((string *)&local_698);
        std::__cxx11::string::~string((string *)&local_678);
        tcu::LogNumber<float>::~LogNumber(&local_130);
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::string::~string((string *)&local_988);
        std::__cxx11::string::~string((string *)&local_968);
        tcu::LogNumber<float>::~LogNumber(&local_3a0);
        std::__cxx11::string::~string((string *)&local_658);
        std::__cxx11::string::~string((string *)&local_948);
        std::__cxx11::string::~string((string *)&local_928);
        tcu::LogNumber<float>::~LogNumber(&local_338);
        std::__cxx11::string::~string((string *)&local_638);
        std::__cxx11::string::~string((string *)&local_908);
        std::__cxx11::string::~string((string *)&local_8e8);
        tcu::LogNumber<float>::~LogNumber(&local_4b8);
        std::__cxx11::string::~string((string *)&local_618);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::__cxx11::string::~string((string *)&local_8a8);
        tcu::LogNumber<float>::~LogNumber(&local_450);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)&local_888);
        std::__cxx11::string::~string((string *)&local_868);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&endApproximation);
        std::__cxx11::string::~string((string *)&section);
        std::__cxx11::string::~string((string *)&local_a48);
        std::__cxx11::string::~string((string *)&local_a28);
        tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&startApproximation);
        std::__cxx11::string::~string((string *)&local_9c8);
        std::__cxx11::string::~string((string *)&local_a08);
        std::__cxx11::string::~string((string *)&local_9e8);
        tcu::ScopedLogSection::~ScopedLogSection(&section_1);
      }
    }
    do {
      std::
      vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
      ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                 *)((long)&buckets[0].
                           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar19));
      endNdx = (int)uVar22;
      lVar19 = lVar19 + -0x18;
    } while (lVar19 != -0x18);
  }
  p_Var23 = local_b20;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&startApproximation,"Results",(allocator<char> *)&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&endApproximation,"Results",(allocator<char> *)&local_4b8);
  tcu::ScopedLogSection::ScopedLogSection
            (&section_2,log,(string *)&startApproximation,(string *)&endApproximation);
  std::__cxx11::string::~string((string *)&endApproximation);
  std::__cxx11::string::~string((string *)&startApproximation);
  fVar26 = (float)((*(int *)(*(long *)(p_Var23 + 8) + -0x20) + **(int **)p_Var23) / 2);
  fVar32 = theilSenFitting.coefficient * fVar26;
  fVar27 = theilSenFitting.offset + fVar32;
  uVar17 = (ulong)(*(long *)(p_Var23 + 8) - (long)*(int **)p_Var23) >> 5;
  uVar17 = (long)((ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff) / 2;
  local_b20._0_4_ = fVar26;
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>>
            (&startApproximation,p_Var23,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              *)0x0,(int)uVar17,endNdx,in_R9);
  Performance::(anonymous_namespace)::
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>>
            (&endApproximation,p_Var23,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              *)(uVar17 & 0xffffffff),(int)((ulong)(*(long *)(p_Var23 + 8) - *(long *)p_Var23) >> 5)
             ,endNdx,in_R9);
  fVar31 = endApproximation.coefficient;
  fVar26 = endApproximation.offset;
  lVar19 = *(long *)p_Var23;
  lVar24 = *(long *)(p_Var23 + 8);
  fVar28 = (float)*(int *)(lVar19 + 8);
  fVar35 = startApproximation.offset;
  fVar10 = startApproximation.coefficient;
  fVar33 = (float)*(int *)(lVar24 + -0x18);
  local_b08._0_4_ = fVar28;
  local_b10 = CONCAT44(local_b10._4_4_,fVar33);
  fVar28 = getAreaBetweenLines(fVar28,fVar33,startApproximation.offset,
                               startApproximation.coefficient,endApproximation.offset,
                               endApproximation.coefficient);
  local_af0 = CONCAT44(local_af0._4_4_,fVar28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            (&startApproximation,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              *)p_Var23,0,(int)((ulong)(lVar24 - lVar19) >> 5),2,in_R9);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            (&endApproximation,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>_>_>
              *)p_Var23,1,(int)((ulong)(*(long *)(p_Var23 + 8) - *(long *)p_Var23) >> 5),2,in_R9);
  fVar33 = (float)*(int *)(*(long *)p_Var23 + 8);
  fVar28 = startApproximation.offset;
  xmax = (float)*(int *)(*(long *)(p_Var23 + 8) + -0x18);
  local_3d8 = ZEXT416((uint)startApproximation.coefficient);
  local_3e8 = ZEXT416((uint)endApproximation.coefficient);
  fVar29 = getAreaBetweenLines(fVar33,xmax,startApproximation.offset,startApproximation.coefficient,
                               endApproximation.offset,endApproximation.coefficient);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buckets,"ResultLinearity",(allocator<char> *)&local_3c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stats,"Sample linearity",(allocator<char> *)&section_1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"%",&local_b21);
  fVar30 = fVar10 * (float)local_b08._0_4_ + fVar35;
  fVar34 = fVar31 * (float)local_b08._0_4_ + fVar26;
  uVar11 = -(uint)(fVar30 <= fVar34);
  fVar35 = fVar10 * (float)local_b10 + fVar35;
  fVar26 = fVar31 * (float)local_b10 + fVar26;
  uVar25 = -(uint)(fVar26 <= fVar35);
  fVar26 = ((float)(~uVar25 & (uint)fVar26 | (uint)fVar35 & uVar25) -
           (float)(~uVar11 & (uint)fVar34 | (uint)fVar30 & uVar11)) *
           ((float)local_b10 - (float)local_b08._0_4_);
  fVar31 = (float)(~-(uint)(fVar26 < 1e-06) & (uint)(1.0 - (float)local_af0 / fVar26));
  fVar26 = 1.0;
  if (fVar31 <= 1.0) {
    fVar26 = fVar31;
  }
  psVar15 = &local_9e8;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&startApproximation,(string *)buckets,(string *)&stats,psVar15,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar31 < 0.0) & (uint)(fVar26 * 100.0)));
  tcu::LogNumber<float>::write
            ((LogNumber<float> *)&startApproximation,__fd,__buf_16,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a08,"SampleTemporalStability",&local_b22);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9c8,"Sample temporal stability",&local_b23);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a28,"%",&local_b24);
  fVar26 = (float)local_3d8._0_4_ * fVar33 + fVar28;
  fVar31 = (float)local_3e8._0_4_ * fVar33 + endApproximation.offset;
  uVar11 = -(uint)(fVar26 <= fVar31);
  fVar28 = (float)local_3d8._0_4_ * xmax + fVar28;
  fVar35 = (float)local_3e8._0_4_ * xmax + endApproximation.offset;
  uVar25 = -(uint)(fVar35 <= fVar28);
  fVar26 = ((float)(~uVar25 & (uint)fVar35 | (uint)fVar28 & uVar25) -
           (float)(~uVar11 & (uint)fVar31 | (uint)fVar26 & uVar11)) * (xmax - fVar33);
  fVar31 = (float)(~-(uint)(fVar26 < 1e-06) & (uint)(1.0 - fVar29 / fVar26));
  fVar26 = 1.0;
  if (fVar31 <= 1.0) {
    fVar26 = fVar31;
  }
  psVar15 = &local_a28;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)&endApproximation,&local_a08,&local_9c8,psVar15,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar31 < 0.0) & (uint)(fVar26 * 100.0)));
  tcu::LogNumber<float>::write((LogNumber<float> *)&endApproximation,__fd,__buf_17,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a48,"ApproximatedConstantCost",&local_b25);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&section,"Approximated contant cost",&local_b26);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"us",&local_b27);
  psVar15 = &local_868;
  tcu::LogNumber<float>::LogNumber
            (&local_450,&local_a48,(string *)&section,psVar15,QP_KEY_TAG_TIME,theilSenFitting.offset
            );
  tcu::LogNumber<float>::write(&local_450,__fd,__buf_18,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_888,"ApproximatedConstantCostConfidence60Lower",&local_b28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"Approximated contant cost 60% confidence lower limit",&local_b29)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a8,"us",&local_b2a);
  psVar15 = &local_8a8;
  tcu::LogNumber<float>::LogNumber
            (&local_4b8,&local_888,&local_5f8,psVar15,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceLower);
  tcu::LogNumber<float>::write(&local_4b8,__fd,__buf_19,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,"ApproximatedConstantCostConfidence60Upper",&local_b2b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"Approximated contant cost 60% confidence upper limit",&local_b2c)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"us",&local_b2d);
  psVar15 = &local_8e8;
  tcu::LogNumber<float>::LogNumber
            (&local_338,&local_8c8,&local_618,psVar15,QP_KEY_TAG_TIME,
             theilSenFitting.offsetConfidenceUpper);
  tcu::LogNumber<float>::write(&local_338,__fd,__buf_20,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_908,"ApproximatedLinearCost",&local_b2e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"Approximated linear cost",&local_b2f);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_928,"us / MB",&local_b30);
  psVar15 = &local_928;
  tcu::LogNumber<float>::LogNumber
            (&local_3a0,&local_908,&local_638,psVar15,QP_KEY_TAG_TIME,
             theilSenFitting.coefficient * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_3a0,__fd,__buf_21,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_948,"ApproximatedLinearCostConfidence60Lower",&local_b31);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"Approximated linear cost 60% confidence lower limit",&local_b32);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_968,"us / MB",&local_b33);
  psVar15 = &local_968;
  tcu::LogNumber<float>::LogNumber
            (&local_130,&local_948,&local_658,psVar15,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_130,__fd,__buf_22,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_988,"ApproximatedLinearCostConfidence60Upper",&local_b34);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,"Approximated linear cost 60% confidence upper limit",&local_b35);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"us / MB",&local_b36);
  psVar15 = &local_678;
  tcu::LogNumber<float>::LogNumber
            (&local_198,&local_988,&local_538,psVar15,QP_KEY_TAG_TIME,
             theilSenFitting.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::LogNumber<float>::write(&local_198,__fd,__buf_23,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,"ApproximatedTransferRate",&local_b37);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"Approximated transfer rate",&local_b38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"MB / s",&local_b39);
  fVar26 = local_b20._0_4_ / ((fVar27 / 1000.0) / 1000.0);
  local_b08 = ZEXT416((uint)fVar26);
  psVar15 = &local_6b8;
  tcu::LogNumber<float>::LogNumber
            (&local_200,&local_698,&local_558,psVar15,QP_KEY_TAG_PERFORMANCE,
             fVar26 * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_200,__fd,__buf_24,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d8,"ApproximatedTransferRateNoConstant",&local_b3a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"Approximated transfer rate without constant cost",&local_b3b);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f8,"MB / s",&local_b3c);
  local_b20._0_4_ = local_b20._0_4_ / ((fVar32 / 1000.0) / 1000.0);
  psVar15 = &local_6f8;
  tcu::LogNumber<float>::LogNumber
            (&local_268,&local_6d8,&local_578,psVar15,QP_KEY_TAG_PERFORMANCE,
             local_b20._0_4_ * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_268,__fd,__buf_25,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"SampleMedianTime",&local_b3d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"Median sample time",&local_b3e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"us",&local_b3f);
  psVar15 = &local_738;
  tcu::LogNumber<float>::LogNumber
            (&local_2d0,&local_718,&local_598,psVar15,QP_KEY_TAG_TIME,resultStats.result.medianTime)
  ;
  tcu::LogNumber<float>::write(&local_2d0,__fd,__buf_26,(size_t)psVar15);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_758,"SampleMedianTransfer",&local_b40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"Median transfer rate",&local_b41);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_778,"MB / s",&local_b42);
  psVar15 = &local_778;
  tcu::LogNumber<float>::LogNumber
            (&local_c8,&local_758,&local_5b8,psVar15,QP_KEY_TAG_PERFORMANCE,
             resultStats.medianRate * 0.0009765625 * 0.0009765625);
  tcu::LogNumber<float>::write(&local_c8,__fd,__buf_27,(size_t)psVar15);
  tcu::LogNumber<float>::~LogNumber(&local_c8);
  std::__cxx11::string::~string((string *)&local_778);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_758);
  tcu::LogNumber<float>::~LogNumber(&local_2d0);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_718);
  tcu::LogNumber<float>::~LogNumber(&local_268);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_6d8);
  tcu::LogNumber<float>::~LogNumber(&local_200);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_698);
  tcu::LogNumber<float>::~LogNumber(&local_198);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_988);
  tcu::LogNumber<float>::~LogNumber(&local_130);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::~string((string *)&local_948);
  tcu::LogNumber<float>::~LogNumber(&local_3a0);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_908);
  tcu::LogNumber<float>::~LogNumber(&local_338);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::string::~string((string *)&local_8c8);
  tcu::LogNumber<float>::~LogNumber(&local_4b8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_888);
  tcu::LogNumber<float>::~LogNumber(&local_450);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&section);
  std::__cxx11::string::~string((string *)&local_a48);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&endApproximation);
  std::__cxx11::string::~string((string *)&local_a28);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::__cxx11::string::~string((string *)&local_a08);
  tcu::LogNumber<float>::~LogNumber((LogNumber<float> *)&startApproximation);
  std::__cxx11::string::~string((string *)&local_9e8);
  std::__cxx11::string::~string((string *)&stats);
  std::__cxx11::string::~string((string *)buckets);
  tcu::ScopedLogSection::~ScopedLogSection(&section_2);
  UVar37.transferRateAtRange = (float)local_b08._0_4_;
  UVar37.transferRateMedian = resultStats.medianRate;
  UVar37.transferRateAtInfinity = local_b20._0_4_;
  return UVar37;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}